

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O2

void __thiscall Assimp::MD3Importer::ValidateHeaderOffsets(MD3Importer *this)

{
  uint uVar1;
  uint uVar2;
  Logger *this_00;
  Header *pHVar3;
  DeadlyImportError *pDVar4;
  allocator<char> local_39;
  string local_38;
  
  pHVar3 = this->pcHeader;
  if ((pHVar3->IDENT != 0x33504449) && (pHVar3->IDENT != 0x49445033)) {
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Invalid MD3 file: Magic bytes not found",&local_39);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_38);
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0xf < pHVar3->VERSION) {
    this_00 = DefaultLogger::get();
    Logger::warn(this_00,"Unsupported MD3 file version. Continuing happily ...");
    pHVar3 = this->pcHeader;
  }
  uVar1 = pHVar3->NUM_SURFACES;
  if ((ulong)uVar1 == 0) {
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Invalid md3 file: NUM_SURFACES is 0",&local_39);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_38);
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2 = this->fileSize;
  if (((uVar2 <= pHVar3->OFS_FRAMES) || (uVar2 <= pHVar3->OFS_SURFACES)) ||
     (uVar2 < pHVar3->OFS_EOF)) {
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Invalid MD3 header: some offsets are outside the file",&local_39
              );
    DeadlyImportError::DeadlyImportError(pDVar4,&local_38);
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0x25ed09 < uVar1) {
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Invalid MD3 header: too many surfaces, would overflow",&local_39
              );
    DeadlyImportError::DeadlyImportError(pDVar4,&local_38);
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((ulong)pHVar3->OFS_SURFACES + (ulong)uVar1 * 0x6c < (ulong)uVar2) {
    if (this->configFrameID < pHVar3->NUM_FRAMES) {
      return;
    }
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"The requested frame is not existing the file",&local_39);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_38);
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Invalid MD3 header: some surfaces are outside the file",&local_39)
  ;
  DeadlyImportError::DeadlyImportError(pDVar4,&local_38);
  __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MD3Importer::ValidateHeaderOffsets()
{
    // Check magic number
    if (pcHeader->IDENT != AI_MD3_MAGIC_NUMBER_BE &&
        pcHeader->IDENT != AI_MD3_MAGIC_NUMBER_LE)
            throw DeadlyImportError( "Invalid MD3 file: Magic bytes not found");

    // Check file format version
    if (pcHeader->VERSION > 15)
        ASSIMP_LOG_WARN( "Unsupported MD3 file version. Continuing happily ...");

    // Check some offset values whether they are valid
    if (!pcHeader->NUM_SURFACES)
        throw DeadlyImportError( "Invalid md3 file: NUM_SURFACES is 0");

    if (pcHeader->OFS_FRAMES >= fileSize || pcHeader->OFS_SURFACES >= fileSize ||
        pcHeader->OFS_EOF > fileSize) {
        throw DeadlyImportError("Invalid MD3 header: some offsets are outside the file");
    }

	if (pcHeader->NUM_SURFACES > AI_MAX_ALLOC(MD3::Surface)) {
        throw DeadlyImportError("Invalid MD3 header: too many surfaces, would overflow");
	}

    if (pcHeader->OFS_SURFACES + pcHeader->NUM_SURFACES * sizeof(MD3::Surface) >= fileSize) {
        throw DeadlyImportError("Invalid MD3 header: some surfaces are outside the file");
    }

    if (pcHeader->NUM_FRAMES <= configFrameID )
        throw DeadlyImportError("The requested frame is not existing the file");
}